

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USS.h
# Opt level: O2

void __thiscall USS<4U>::Init(USS<4U> *this,Data<4U> *item)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  StreamSummary<4U> *this_00;
  
  bVar1 = StreamSummary<4U>::Add_Data(this->summary,item);
  if (bVar1) {
    return;
  }
  this_00 = this->summary;
  if ((this_00->mp)._M_h._M_element_count < (ulong)this_00->SIZE) {
    bVar1 = true;
  }
  else {
    uVar2 = std::random_device::_M_getval();
    this_00 = this->summary;
    if ((this_00->mp)._M_h._M_element_count < (ulong)this_00->SIZE) {
      uVar3 = 1;
    }
    else {
      uVar3 = (ulong)(((this_00->min_bucket->super_Node<int>).next)->ID + 1);
    }
    if ((int)((uVar2 & 0xffffffff) % uVar3) != 0) {
      StreamSummary<4U>::Add_Min(this_00);
      return;
    }
    bVar1 = false;
  }
  StreamSummary<4U>::Add_Counter(this_00,item,bVar1);
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item) {
		if (!summary->Add_Data(item)) {
			if (summary->isFull()) {
				if (rd() % (summary->Min_Num() + 1) == 0) {
					summary->Add_Counter(item, false);
				}
				else {
					summary->Add_Min();
				}
			}
			else {
				summary->Add_Counter(item, true);
			}
		}
	}